

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::Composition::Composition
          (Composition *this,shared_ptr<rlottie::internal::model::Composition> *model)

{
  Layer *pLVar1;
  element_type *this_00;
  VSize VVar2;
  shared_ptr<rlottie::internal::model::Composition> *in_RSI;
  VArenaAlloc *in_RDI;
  Layer *in_stack_ffffffffffffffe8;
  
  SurfaceCache::SurfaceCache((SurfaceCache *)in_RDI);
  VBitmap::VBitmap((VBitmap *)0x15de5f);
  VMatrix::VMatrix((VMatrix *)&in_RDI->fFirstSize);
  VSize::VSize((VSize *)&in_RDI[1].fFirstBlock);
  std::shared_ptr<rlottie::internal::model::Composition>::shared_ptr
            ((shared_ptr<rlottie::internal::model::Composition> *)0x15de89);
  in_RDI[2].fDtorCursor = (char *)0x0;
  VArenaAlloc::VArenaAlloc(in_RDI,(size_t)in_RSI);
  *(undefined4 *)&in_RDI[3].fCursor = 0xffffffff;
  *(undefined1 *)((long)&in_RDI[3].fCursor + 4) = 1;
  *(undefined1 *)((long)&in_RDI[3].fCursor + 5) = 0;
  std::shared_ptr<rlottie::internal::model::Composition>::operator=
            ((shared_ptr<rlottie::internal::model::Composition> *)in_RDI,in_RSI);
  std::
  __shared_ptr_access<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x15dedc);
  pLVar1 = createLayerItem(in_stack_ffffffffffffffe8,in_RDI);
  in_RDI[2].fDtorCursor = (char *)pLVar1;
  Layer::setComplexContent((Layer *)in_RDI[2].fDtorCursor,false);
  this_00 = std::
            __shared_ptr_access<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<rlottie::internal::model::Composition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x15df13);
  VVar2 = internal::model::Composition::size(this_00);
  in_RDI[1].fFirstBlock = (char *)VVar2;
  return;
}

Assistant:

renderer::Composition::Composition(std::shared_ptr<model::Composition> model)
    : mCurFrameNo(-1)
{
    mModel = std::move(model);
    mRootLayer = createLayerItem(mModel->mRootLayer, &mAllocator);
    mRootLayer->setComplexContent(false);
    mViewSize = mModel->size();
}